

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_handle_map_notify(natwm_state *state,xcb_window_t window)

{
  uint16_t previous_border_width;
  workspace *workspace_00;
  client *client_00;
  uint16_t border_width;
  client *client;
  workspace *workspace;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  workspace_00 = workspace_list_find_window_workspace(state->workspace_list,window);
  if (workspace_00 == (workspace *)0x0) {
    state_local._4_4_ = NO_ERROR;
  }
  else {
    client_00 = workspace_find_window_client(workspace_00,window);
    if (client_00 == (client *)0x0) {
      state_local._4_4_ = NOT_FOUND_ERROR;
    }
    else if (((client_00->state & CLIENT_OFF_SCREEN) == 0) || ((workspace_00->is_visible & 1U) == 0)
            ) {
      state_local._4_4_ = NO_ERROR;
    }
    else {
      if (((client_00->is_focused & 1U) == 0) || ((workspace_00->is_focused & 1U) == 0)) {
        client_00->state = client_00->state & 0xf7;
      }
      else {
        previous_border_width =
             client_get_active_border_width(state->workspace_list->theme,client_00);
        client_00->state = client_00->state & 0xf7;
        update_theme(state,client_00,previous_border_width);
      }
      state_local._4_4_ = NO_ERROR;
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_handle_map_notify(const struct natwm_state *state, xcb_window_t window)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, window);

        if (workspace == NULL) {
                // We do not have this window in our registry
                return NO_ERROR;
        }

        struct client *client = workspace_find_window_client(workspace, window);

        if (client == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (!(client->state & CLIENT_OFF_SCREEN) || !workspace->is_visible) {
                return NO_ERROR;
        }

        if (client->is_focused && workspace->is_focused) {
                // We need to get the previous border_width before removing
                // CLIENT_OFF_SCREEN
                uint16_t border_width
                        = client_get_active_border_width(state->workspace_list->theme, client);

                client->state &= (uint8_t)~CLIENT_OFF_SCREEN;

                update_theme(state, client, border_width);
        } else {
                client->state &= (uint8_t)~CLIENT_OFF_SCREEN;
        }

        return NO_ERROR;
}